

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtcTimeStampTestCase.cpp
# Opt level: O2

void __thiscall SuiteUtcTimeStampTests::Testsubtract::RunImpl(Testsubtract *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int local_80 [2];
  TestDetails local_78;
  UtcTimeStamp mid;
  UtcTimeStamp lg;
  UtcTimeStamp sm;
  
  FIX::UtcTimeStamp::UtcTimeStamp(&sm,10,10,10,10,10,2000);
  FIX::UtcTimeStamp::UtcTimeStamp(&lg,10,10,0x14,10,10,2000);
  FIX::UtcTimeStamp::UtcTimeStamp(&mid,10,10,0xf,10,10,2000);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_80[1] = 0;
  local_80[0] = (int)(sm.super_DateTime.m_time / 1000000000) +
                (int)(sm.super_DateTime.m_time / -1000000000);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0x4a);
  UnitTest::CheckEqual<int,int>(pTVar1,local_80 + 1,local_80,&local_78);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_80[1] = 0xfffffff6;
  local_80[0] = (int)(lg.super_DateTime.m_time / -1000000000) +
                (int)(sm.super_DateTime.m_time / 1000000000) +
                (sm.super_DateTime.m_date - lg.super_DateTime.m_date) * 0x15180;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0x4b);
  UnitTest::CheckEqual<int,int>(pTVar1,local_80 + 1,local_80,&local_78);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_80[1] = 0xfffffffb;
  local_80[0] = (int)(mid.super_DateTime.m_time / -1000000000) +
                (int)(sm.super_DateTime.m_time / 1000000000) +
                (sm.super_DateTime.m_date - mid.super_DateTime.m_date) * 0x15180;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0x4c);
  UnitTest::CheckEqual<int,int>(pTVar1,local_80 + 1,local_80,&local_78);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_80[1] = 5;
  local_80[0] = (int)(sm.super_DateTime.m_time / -1000000000) +
                (int)(mid.super_DateTime.m_time / 1000000000) +
                (mid.super_DateTime.m_date - sm.super_DateTime.m_date) * 0x15180;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0x4e);
  UnitTest::CheckEqual<int,int>(pTVar1,local_80 + 1,local_80,&local_78);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_80[1] = 0xfffffffb;
  local_80[0] = (int)(lg.super_DateTime.m_time / -1000000000) +
                (int)(mid.super_DateTime.m_time / 1000000000) +
                (mid.super_DateTime.m_date - lg.super_DateTime.m_date) * 0x15180;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0x4f);
  UnitTest::CheckEqual<int,int>(pTVar1,local_80 + 1,local_80,&local_78);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_80[1] = 0;
  local_80[0] = (int)(mid.super_DateTime.m_time / 1000000000) +
                (int)(mid.super_DateTime.m_time / -1000000000);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0x50);
  UnitTest::CheckEqual<int,int>(pTVar1,local_80 + 1,local_80,&local_78);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_80[1] = 10;
  local_80[0] = (int)(sm.super_DateTime.m_time / -1000000000) +
                (int)(lg.super_DateTime.m_time / 1000000000) +
                (lg.super_DateTime.m_date - sm.super_DateTime.m_date) * 0x15180;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0x52);
  UnitTest::CheckEqual<int,int>(pTVar1,local_80 + 1,local_80,&local_78);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_80[1] = 0;
  local_80[0] = (int)(lg.super_DateTime.m_time / 1000000000) +
                (int)(lg.super_DateTime.m_time / -1000000000);
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0x53);
  UnitTest::CheckEqual<int,int>(pTVar1,local_80 + 1,local_80,&local_78);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_80[1] = 5;
  local_80[0] = (int)(mid.super_DateTime.m_time / -1000000000) +
                (int)(lg.super_DateTime.m_time / 1000000000) +
                (lg.super_DateTime.m_date - mid.super_DateTime.m_date) * 0x15180;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_78,*ppTVar3,0x54);
  UnitTest::CheckEqual<int,int>(pTVar1,local_80 + 1,local_80,&local_78);
  return;
}

Assistant:

TEST(subtract)
{
  UtcTimeStamp sm( 10, 10, 10, 10, 10, 2000 );
  UtcTimeStamp lg( 10, 10, 20, 10, 10, 2000 );
  UtcTimeStamp mid( 10, 10, 15, 10, 10, 2000 );

  CHECK_EQUAL( 0, ( sm - sm ) );
  CHECK_EQUAL( -10, ( sm - lg ) );
  CHECK_EQUAL( -5, ( sm - mid ) );

  CHECK_EQUAL( 5, ( mid - sm ) );
  CHECK_EQUAL( -5, ( mid - lg ) );
  CHECK_EQUAL( 0, ( mid - mid ) );

  CHECK_EQUAL( 10, ( lg - sm ) );
  CHECK_EQUAL( 0, ( lg - lg ) );
  CHECK_EQUAL( 5, ( lg - mid ) );
}